

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels(uchar *pixels,int type,int w,int h,Allocator *allocator)

{
  uint uVar1;
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  Mat *in_RDI;
  Allocator *in_stack_00000010;
  int type_from;
  int w_00;
  int type_00;
  
  uVar1 = in_EDX & 0xffff;
  type_00 = (int)((ulong)in_RSI >> 0x20);
  w_00 = (int)in_RSI;
  if ((uVar1 == 1) || (uVar1 == 2)) {
    from_pixels((uchar *)in_RDI,type_00,w_00,in_EDX,in_ECX,in_stack_00000010);
  }
  else if (uVar1 == 3) {
    from_pixels((uchar *)in_RDI,type_00,w_00,in_EDX,in_ECX,in_stack_00000010);
  }
  else if ((uVar1 == 4) || (uVar1 == 5)) {
    from_pixels((uchar *)in_RDI,type_00,w_00,in_EDX,in_ECX,in_stack_00000010);
  }
  else {
    fprintf(_stderr,"unknown convert type %d",(ulong)in_EDX);
    fprintf(_stderr,"\n");
    Mat(in_RDI);
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, Allocator* allocator)
{
    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 3, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 1, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        return Mat::from_pixels(pixels, type, w, h, w * 4, allocator);
    }

    // unknown convert type
    NCNN_LOGE("unknown convert type %d", type);
    return Mat();
}